

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<big_integer,big_integer>
          (char *expected_expression,char *actual_expression,big_integer *expected,
          big_integer *actual)

{
  bool bVar1;
  string *in_RCX;
  big_integer *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  big_integer *in_RDI;
  undefined8 in_R8;
  AssertionResult AVar3;
  big_integer *pbVar4;
  big_integer *in_stack_ffffffffffffff88;
  string local_68 [32];
  string local_48 [39];
  undefined1 ignoring_case;
  big_integer *expected_value;
  big_integer *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  ignoring_case = (undefined1)((ulong)in_R8 >> 0x38);
  pbVar4 = in_RDI;
  expected_expression_00 = in_RDI;
  bVar1 = operator==(in_stack_ffffffffffffff88,in_RDI);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    expected_value = in_RDX;
    FormatForComparisonFailureMessage<big_integer,big_integer>(in_RDI,in_RDX);
    FormatForComparisonFailureMessage<big_integer,big_integer>(in_RDI,in_RDX);
    EqFailure(&expected_expression_00->sign,in_RSI,(string *)expected_value,in_RCX,
              (bool)ignoring_case);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = pbVar4;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}